

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opt-fuzz.cpp
# Opt level: O0

void anon_unknown.dwarf_23886::generate(void)

{
  Value *pVVar1;
  BranchInst *this;
  Function *pFVar2;
  arg_iterator pAVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  Module *pMVar9;
  FunctionType *pFVar10;
  IRBuilder<llvm::NoFolder,_llvm::IRBuilderDefaultInserter> *pIVar11;
  reference ppBVar12;
  size_type sVar13;
  reference ppVVar14;
  arg_iterator pAVar15;
  reference ppTVar16;
  ulong uVar17;
  Twine *pTVar18;
  Type *pTVar19;
  Twine *Name;
  reference ppBVar20;
  reference Val;
  reference Val_00;
  ret_type this_00;
  BasicBlock *pBVar21;
  reference pBVar22;
  undefined1 auVar23 [12];
  pointer *local_3b8;
  uint local_390;
  Self local_358;
  pred_iterator E_1;
  pred_iterator PI_1;
  int p_1;
  BasicBlock *bb_1;
  iterator __end1_2;
  iterator __begin1_2;
  Function *__range1_2;
  bool first;
  undefined1 local_308 [12];
  Value *local_2f8;
  Value *V_1;
  BasicBlock *Pred;
  pred_iterator E;
  pred_iterator PI;
  BasicBlock *BB;
  PHINode *P;
  inst_iterator pe;
  inst_iterator p;
  Instruction *i_3;
  iterator __end2;
  iterator __begin2;
  BasicBlock *__range2;
  bool notphi;
  BasicBlock *bb;
  iterator __end1_1;
  iterator __begin1_1;
  Function *__range1_1;
  BasicBlock *BB1;
  BranchInst **bi;
  iterator __end1;
  iterator __begin1;
  vector<llvm::BranchInst_*,_std::allocator<llvm::BranchInst_*>_> *__range1;
  undefined1 local_1d8 [12];
  TypeSize local_1c8 [16];
  Value *local_1b8;
  Value *V;
  undefined4 local_1a8;
  Value *local_1a0;
  undefined4 local_198;
  int local_18c;
  arg_iterator pAStack_188;
  int W_1;
  arg_iterator it;
  undefined1 auStack_178 [4];
  uint i_2;
  undefined4 local_170;
  undefined1 local_168 [12];
  int local_154;
  undefined1 local_150 [4];
  int W;
  LoadInst *local_128;
  Value *a;
  uint i_1;
  int Budget;
  Twine local_108;
  BasicBlock *local_e0;
  Twine local_d8;
  undefined8 local_b0;
  undefined8 local_a8;
  FunctionType *local_a0;
  FunctionType *FuncTy;
  int RetWidth;
  int i;
  vector<llvm::Type_*,_std::allocator<llvm::Type_*>_> MT;
  vector<llvm::Type_*,_std::allocator<llvm::Type_*>_> RealArgsTy;
  vector<llvm::Type_*,_std::allocator<llvm::Type_*>_> ArgsTy;
  StringRef local_38 [2];
  StringRef local_18;
  
  pMVar9 = (Module *)operator_new(800);
  llvm::StringRef::StringRef(&local_18,"");
  llvm::Module::Module(pMVar9,local_18,(LLVMContext *)&(anonymous_namespace)::C);
  (anonymous_namespace)::M = pMVar9;
  bVar4 = llvm::cl::opt_storage::operator_cast_to_bool
                    ((opt_storage *)((anonymous_namespace)::ARM64 + 0x80));
  pMVar9 = (anonymous_namespace)::M;
  if (bVar4) {
    llvm::StringRef::StringRef(local_38,"aarch64-unknown-linux-gnu");
    llvm::Module::setTargetTriple(pMVar9,local_38[0]);
    pMVar9 = (anonymous_namespace)::M;
    llvm::StringRef::StringRef
              ((StringRef *)
               &ArgsTy.super__Vector_base<llvm::Type_*,_std::allocator<llvm::Type_*>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,
               "e-m:e-i8:8:32-i16:16:32-i64:64-i128:128-n32:64-S128");
    llvm::Module::setDataLayout(pMVar9,stack0xffffffffffffffb8);
  }
  std::vector<llvm::Type_*,_std::allocator<llvm::Type_*>_>::vector
            ((vector<llvm::Type_*,_std::allocator<llvm::Type_*>_> *)
             &RealArgsTy.super__Vector_base<llvm::Type_*,_std::allocator<llvm::Type_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<llvm::Type_*,_std::allocator<llvm::Type_*>_>::vector
            ((vector<llvm::Type_*,_std::allocator<llvm::Type_*>_> *)
             &MT.super__Vector_base<llvm::Type_*,_std::allocator<llvm::Type_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<llvm::Type_*,_std::allocator<llvm::Type_*>_>::vector
            ((vector<llvm::Type_*,_std::allocator<llvm::Type_*>_> *)&RetWidth);
  for (FuncTy._4_4_ = 0; iVar7 = FuncTy._4_4_,
      iVar6 = llvm::cl::opt_storage::operator_cast_to_int
                        ((opt_storage *)((anonymous_namespace)::N + 0x80)), iVar7 < iVar6 + 2;
      FuncTy._4_4_ = FuncTy._4_4_ + 1) {
    iVar7 = llvm::cl::opt_storage::operator_cast_to_int
                      ((opt_storage *)((anonymous_namespace)::W + 0x80));
    makeArg(iVar7,(vector<llvm::Type_*,_std::allocator<llvm::Type_*>_> *)
                  &RealArgsTy.super__Vector_base<llvm::Type_*,_std::allocator<llvm::Type_*>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage,
            (vector<llvm::Type_*,_std::allocator<llvm::Type_*>_> *)
            &MT.super__Vector_base<llvm::Type_*,_std::allocator<llvm::Type_*>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage);
    iVar7 = llvm::cl::opt_storage::operator_cast_to_int
                      ((opt_storage *)((anonymous_namespace)::W + 0x80));
    makeArg(iVar7,(vector<llvm::Type_*,_std::allocator<llvm::Type_*>_> *)
                  &RealArgsTy.super__Vector_base<llvm::Type_*,_std::allocator<llvm::Type_*>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage,
            (vector<llvm::Type_*,_std::allocator<llvm::Type_*>_> *)
            &MT.super__Vector_base<llvm::Type_*,_std::allocator<llvm::Type_*>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage);
    makeArg(1,(vector<llvm::Type_*,_std::allocator<llvm::Type_*>_> *)
              &RealArgsTy.super__Vector_base<llvm::Type_*,_std::allocator<llvm::Type_*>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage,
            (vector<llvm::Type_*,_std::allocator<llvm::Type_*>_> *)
            &MT.super__Vector_base<llvm::Type_*,_std::allocator<llvm::Type_*>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage);
    iVar7 = llvm::cl::opt_storage::operator_cast_to_int
                      ((opt_storage *)((anonymous_namespace)::W + 0x80));
    makeArg(iVar7 / 2,
            (vector<llvm::Type_*,_std::allocator<llvm::Type_*>_> *)
            &RealArgsTy.super__Vector_base<llvm::Type_*,_std::allocator<llvm::Type_*>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage,
            (vector<llvm::Type_*,_std::allocator<llvm::Type_*>_> *)
            &MT.super__Vector_base<llvm::Type_*,_std::allocator<llvm::Type_*>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage);
    iVar7 = llvm::cl::opt_storage::operator_cast_to_int
                      ((opt_storage *)((anonymous_namespace)::W + 0x80));
    makeArg(iVar7 * 2,
            (vector<llvm::Type_*,_std::allocator<llvm::Type_*>_> *)
            &RealArgsTy.super__Vector_base<llvm::Type_*,_std::allocator<llvm::Type_*>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage,
            (vector<llvm::Type_*,_std::allocator<llvm::Type_*>_> *)
            &MT.super__Vector_base<llvm::Type_*,_std::allocator<llvm::Type_*>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage);
  }
  bVar4 = llvm::cl::opt_storage::operator_cast_to_bool
                    ((opt_storage *)((anonymous_namespace)::Geni1 + 0x80));
  if (bVar4) {
    local_390 = 1;
  }
  else {
    local_390 = llvm::cl::opt_storage::operator_cast_to_int
                          ((opt_storage *)((anonymous_namespace)::W + 0x80));
  }
  FuncTy._0_4_ = local_390;
  iVar7 = llvm::cl::opt_storage::operator_cast_to_int
                    ((opt_storage *)((anonymous_namespace)::Promote + 0x80));
  if ((iVar7 != -1) &&
     (iVar7 = llvm::cl::opt_storage::operator_cast_to_int
                        ((opt_storage *)((anonymous_namespace)::Promote + 0x80)),
     (int)(uint)FuncTy < iVar7)) {
    FuncTy._0_4_ = llvm::cl::opt_storage::operator_cast_to_int
                             ((opt_storage *)((anonymous_namespace)::Promote + 0x80));
  }
  pFVar10 = (FunctionType *)
            llvm::Type::getIntNTy((LLVMContext *)&(anonymous_namespace)::C,(uint)FuncTy);
  bVar4 = llvm::cl::opt_storage::operator_cast_to_bool
                    ((opt_storage *)((anonymous_namespace)::ArgsFromMem + 0x80));
  if (bVar4) {
    local_3b8 = (pointer *)&RetWidth;
  }
  else {
    local_3b8 = &MT.super__Vector_base<llvm::Type_*,_std::allocator<llvm::Type_*>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
  }
  llvm::ArrayRef<llvm::Type*>::ArrayRef<std::allocator<llvm::Type*>>
            ((ArrayRef<llvm::Type*> *)&local_b0,
             (vector<llvm::Type_*,_std::allocator<llvm::Type_*>_> *)local_3b8);
  pFVar10 = (FunctionType *)llvm::FunctionType::get(pFVar10,local_b0,local_a8,0);
  local_a0 = pFVar10;
  llvm::Twine::Twine(&local_d8,(string *)((anonymous_namespace)::BaseName_abi_cxx11_ + 0x80));
  (anonymous_namespace)::F =
       llvm::Function::Create(pFVar10,ExternalLinkage,&local_d8,(anonymous_namespace)::M);
  llvm::Twine::Twine(&local_108,"");
  local_e0 = llvm::BasicBlock::Create
                       ((LLVMContext *)&(anonymous_namespace)::C,&local_108,(anonymous_namespace)::F
                        ,(BasicBlock *)0x0);
  std::vector<llvm::BasicBlock_*,_std::allocator<llvm::BasicBlock_*>_>::push_back
            ((vector<llvm::BasicBlock_*,_std::allocator<llvm::BasicBlock_*>_> *)
             (anonymous_namespace)::BBs,&local_e0);
  pIVar11 = (IRBuilder<llvm::NoFolder,_llvm::IRBuilderDefaultInserter> *)operator_new(0x88);
  ppBVar12 = std::vector<llvm::BasicBlock_*,_std::allocator<llvm::BasicBlock_*>_>::operator[]
                       ((vector<llvm::BasicBlock_*,_std::allocator<llvm::BasicBlock_*>_> *)
                        (anonymous_namespace)::BBs,0);
  pBVar21 = *ppBVar12;
  llvm::ArrayRef<llvm::OperandBundleDefT<llvm::Value_*>_>::ArrayRef
            ((ArrayRef<llvm::OperandBundleDefT<llvm::Value_*>_> *)&i_1,None);
  llvm::IRBuilder<llvm::NoFolder,_llvm::IRBuilderDefaultInserter>::IRBuilder
            (pIVar11,pBVar21,(MDNode *)0x0,_i_1);
  (anonymous_namespace)::Builder = pIVar11;
  a._4_4_ = llvm::cl::opt_storage::operator_cast_to_int
                      ((opt_storage *)((anonymous_namespace)::N + 0x80));
  pIVar11 = (anonymous_namespace)::Builder;
  ppBVar12 = std::vector<llvm::BasicBlock_*,_std::allocator<llvm::BasicBlock_*>_>::operator[]
                       ((vector<llvm::BasicBlock_*,_std::allocator<llvm::BasicBlock_*>_> *)
                        (anonymous_namespace)::BBs,0);
  llvm::IRBuilderBase::SetInsertPoint(&pIVar11->super_IRBuilderBase,*ppBVar12);
  bVar4 = llvm::cl::opt_storage::operator_cast_to_bool
                    ((opt_storage *)((anonymous_namespace)::ArgsFromMem + 0x80));
  if (bVar4) {
    a._0_4_ = 0;
    while( true ) {
      uVar17 = (ulong)(uint)a;
      sVar13 = std::vector<llvm::Type_*,_std::allocator<llvm::Type_*>_>::size
                         ((vector<llvm::Type_*,_std::allocator<llvm::Type_*>_> *)
                          &RealArgsTy.
                           super__Vector_base<llvm::Type_*,_std::allocator<llvm::Type_*>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage);
      pIVar11 = (anonymous_namespace)::Builder;
      if (sVar13 <= uVar17) break;
      ppTVar16 = std::vector<llvm::Type_*,_std::allocator<llvm::Type_*>_>::at
                           ((vector<llvm::Type_*,_std::allocator<llvm::Type_*>_> *)
                            &MT.super__Vector_base<llvm::Type_*,_std::allocator<llvm::Type_*>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage,(ulong)(uint)a);
      pTVar19 = *ppTVar16;
      ppVVar14 = std::vector<llvm::Value_*,_std::allocator<llvm::Value_*>_>::at
                           ((vector<llvm::Value_*,_std::allocator<llvm::Value_*>_> *)
                            (anonymous_namespace)::globs,(ulong)(uint)a);
      pVVar1 = *ppVVar14;
      llvm::Twine::Twine((Twine *)local_150,"");
      local_128 = llvm::IRBuilderBase::CreateLoad
                            (&pIVar11->super_IRBuilderBase,pTVar19,pVVar1,(Twine *)local_150);
      ppTVar16 = std::vector<llvm::Type_*,_std::allocator<llvm::Type_*>_>::at
                           ((vector<llvm::Type_*,_std::allocator<llvm::Type_*>_> *)
                            &RealArgsTy.
                             super__Vector_base<llvm::Type_*,_std::allocator<llvm::Type_*>_>._M_impl
                             .super__Vector_impl_data._M_end_of_storage,(ulong)(uint)a);
      auVar23 = llvm::Type::getPrimitiveSizeInBits(*ppTVar16);
      _auStack_178 = auVar23;
      local_168 = auVar23;
      uVar17 = llvm::TypeSize::operator_cast_to_unsigned_long((TypeSize *)local_168);
      local_154 = (int)uVar17;
      addArg((Value *)local_128,local_154,
             (vector<llvm::Type_*,_std::allocator<llvm::Type_*>_> *)
             &RealArgsTy.super__Vector_base<llvm::Type_*,_std::allocator<llvm::Type_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
      a._0_4_ = (uint)a + 1;
    }
  }
  else {
    it._4_4_ = 0;
    pAStack_188 = llvm::Function::arg_begin((anonymous_namespace)::F);
    while( true ) {
      pAVar3 = pAStack_188;
      pAVar15 = llvm::Function::arg_end((anonymous_namespace)::F);
      if (pAVar3 == pAVar15) break;
      ppTVar16 = std::vector<llvm::Type_*,_std::allocator<llvm::Type_*>_>::at
                           ((vector<llvm::Type_*,_std::allocator<llvm::Type_*>_> *)
                            &RealArgsTy.
                             super__Vector_base<llvm::Type_*,_std::allocator<llvm::Type_*>_>._M_impl
                             .super__Vector_impl_data._M_end_of_storage,(ulong)it._4_4_);
      auVar23 = llvm::Type::getPrimitiveSizeInBits(*ppTVar16);
      local_1a8 = auVar23._8_4_;
      V = auVar23._0_8_;
      local_1a0 = V;
      local_198 = local_1a8;
      uVar17 = llvm::TypeSize::operator_cast_to_unsigned_long((TypeSize *)&local_1a0);
      local_18c = (int)uVar17;
      addArg((Value *)pAStack_188,local_18c,
             (vector<llvm::Type_*,_std::allocator<llvm::Type_*>_> *)
             &RealArgsTy.super__Vector_base<llvm::Type_*,_std::allocator<llvm::Type_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
      it._4_4_ = it._4_4_ + 1;
      pAStack_188 = (arg_iterator)((Value *)pAStack_188 + 0x28);
    }
  }
  bVar4 = llvm::cl::opt_storage::operator_cast_to_bool
                    ((opt_storage *)((anonymous_namespace)::Geni1 + 0x80));
  if (bVar4) {
    local_1b8 = genVal((int *)((long)&a + 4),1,false,false);
  }
  else {
    iVar7 = llvm::cl::opt_storage::operator_cast_to_int
                      ((opt_storage *)((anonymous_namespace)::W + 0x80));
    local_1b8 = genVal((int *)((long)&a + 4),iVar7,false,false);
  }
  pTVar18 = (Twine *)(ulong)(uint)FuncTy;
  pTVar19 = llvm::Value::getType(local_1b8);
  local_1d8 = llvm::Type::getPrimitiveSizeInBits(pTVar19);
  local_1c8._0_12_ = local_1d8;
  Name = (Twine *)llvm::TypeSize::operator_cast_to_unsigned_long(local_1c8);
  pVVar1 = local_1b8;
  pIVar11 = (anonymous_namespace)::Builder;
  if (Name < pTVar18) {
    uVar8 = llvm::cl::opt_storage::operator_cast_to_int
                      ((opt_storage *)((anonymous_namespace)::Promote + 0x80));
    pTVar19 = (Type *)llvm::Type::getIntNTy((LLVMContext *)&(anonymous_namespace)::C,uVar8);
    llvm::Twine::Twine((Twine *)&__range1,"");
    Name = (Twine *)&__range1;
    local_1b8 = llvm::IRBuilderBase::CreateZExt(&pIVar11->super_IRBuilderBase,pVVar1,pTVar19,Name);
  }
  llvm::IRBuilderBase::CreateRet(&(anonymous_namespace)::Builder->super_IRBuilderBase,local_1b8);
  __end1 = std::vector<llvm::BranchInst_*,_std::allocator<llvm::BranchInst_*>_>::begin
                     ((vector<llvm::BranchInst_*,_std::allocator<llvm::BranchInst_*>_> *)
                      (anonymous_namespace)::Branches);
  bi = (BranchInst **)
       std::vector<llvm::BranchInst_*,_std::allocator<llvm::BranchInst_*>_>::end
                 ((vector<llvm::BranchInst_*,_std::allocator<llvm::BranchInst_*>_> *)
                  (anonymous_namespace)::Branches);
  while( true ) {
    bVar4 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<llvm::BranchInst_**,_std::vector<llvm::BranchInst_*,_std::allocator<llvm::BranchInst_*>_>_>
                                *)&bi);
    if (!bVar4) break;
    ppBVar20 = __gnu_cxx::
               __normal_iterator<llvm::BranchInst_**,_std::vector<llvm::BranchInst_*,_std::allocator<llvm::BranchInst_*>_>_>
               ::operator*(&__end1);
    pBVar21 = chooseTarget((BasicBlock *)0x0);
    llvm::BranchInst::setSuccessor(*ppBVar20,0,pBVar21);
    bVar4 = llvm::BranchInst::isConditional(*ppBVar20);
    if (bVar4) {
      this = *ppBVar20;
      pBVar21 = chooseTarget(pBVar21);
      llvm::BranchInst::setSuccessor(this,1,pBVar21);
    }
    __gnu_cxx::
    __normal_iterator<llvm::BranchInst_**,_std::vector<llvm::BranchInst_*,_std::allocator<llvm::BranchInst_*>_>_>
    ::operator++(&__end1);
  }
LAB_002821ab:
  pFVar2 = (anonymous_namespace)::F;
  __end1_1 = llvm::Function::begin((anonymous_namespace)::F);
  bb = (BasicBlock *)llvm::Function::end(pFVar2);
  do {
    bVar4 = llvm::operator!=(&__end1_1,
                             (ilist_iterator<llvm::ilist_detail::node_options<llvm::BasicBlock,_false,_false,_void>,_false,_false>
                              *)&bb);
    if (!bVar4) {
      llvm::inst_begin((inst_iterator *)&pe.BI,(anonymous_namespace)::F);
      llvm::inst_end((inst_iterator *)&P,(anonymous_namespace)::F);
      while( true ) {
        bVar4 = llvm::
                InstIterator<llvm::SymbolTableList<llvm::BasicBlock>,_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::BasicBlock,_false,_false,_void>,_false,_false>,_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::Instruction,_false,_false,_void>,_false,_false>,_llvm::Instruction>
                ::operator!=((InstIterator<llvm::SymbolTableList<llvm::BasicBlock>,_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::BasicBlock,_false,_false,_void>,_false,_false>,_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::Instruction,_false,_false,_void>,_false,_false>,_llvm::Instruction>
                              *)&pe.BI,
                             (InstIterator<llvm::SymbolTableList<llvm::BasicBlock>,_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::BasicBlock,_false,_false,_void>,_false,_false>,_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::Instruction,_false,_false,_void>,_false,_false>,_llvm::Instruction>
                              *)&P);
        pFVar2 = (anonymous_namespace)::F;
        if (!bVar4) break;
        Val_00 = llvm::
                 InstIterator<llvm::SymbolTableList<llvm::BasicBlock>,_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::BasicBlock,_false,_false,_void>,_false,_false>,_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::Instruction,_false,_false,_void>,_false,_false>,_llvm::Instruction>
                 ::operator*((InstIterator<llvm::SymbolTableList<llvm::BasicBlock>,_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::BasicBlock,_false,_false,_void>,_false,_false>,_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::Instruction,_false,_false,_void>,_false,_false>,_llvm::Instruction>
                              *)&pe.BI);
        this_00 = llvm::dyn_cast<llvm::PHINode,llvm::Instruction>(Val_00);
        if (this_00 != (ret_type)0x0) {
          pBVar21 = llvm::Instruction::getParent(&this_00->super_Instruction);
          E = llvm::pred_begin(pBVar21);
          Pred = (BasicBlock *)llvm::pred_end(pBVar21);
          while( true ) {
            bVar4 = llvm::
                    PredIterator<llvm::BasicBlock,_llvm::Value::user_iterator_impl<llvm::User>_>::
                    operator!=(&E,(Self *)&Pred);
            uVar8 = (uint)Name;
            if (!bVar4) break;
            V_1 = (Value *)llvm::
                           PredIterator<llvm::BasicBlock,_llvm::Value::user_iterator_impl<llvm::User>_>
                           ::operator*(&E);
            if (a._4_4_ != 0) {
              die("Budget == 0 failed at line __LINE__");
              llvm::llvm_unreachable_internal
                        ((llvm *)"assert",
                         "/workspace/llm4binary/github/license_c_cmakelists/regehr[P]opt-fuzz/opt-fuzz.cpp"
                         ,(char *)0x374,uVar8);
            }
            pTVar19 = llvm::Value::getType((Value *)this_00);
            auVar23 = llvm::Type::getPrimitiveSizeInBits(pTVar19);
            local_308 = auVar23;
            uVar17 = llvm::TypeSize::operator_cast_to_unsigned_long((TypeSize *)local_308);
            Name = (Twine *)0x0;
            local_2f8 = genVal((int *)((long)&a + 4),(int)uVar17,true,false);
            llvm::PHINode::addIncoming(this_00,local_2f8,(BasicBlock *)V_1);
            llvm::PredIterator<llvm::BasicBlock,_llvm::Value::user_iterator_impl<llvm::User>_>::
            operator++(&E);
          }
        }
        llvm::
        InstIterator<llvm::SymbolTableList<llvm::BasicBlock>,_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::BasicBlock,_false,_false,_void>,_false,_false>,_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::Instruction,_false,_false,_void>,_false,_false>,_llvm::Instruction>
        ::operator++((InstIterator<llvm::SymbolTableList<llvm::BasicBlock>,_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::BasicBlock,_false,_false,_void>,_false,_false>,_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::Instruction,_false,_false,_void>,_false,_false>,_llvm::Instruction>
                      *)&pe.BI);
      }
      bVar4 = true;
      __end1_2 = llvm::Function::begin((anonymous_namespace)::F);
      bb_1 = (BasicBlock *)llvm::Function::end(pFVar2);
      do {
        bVar5 = llvm::operator!=(&__end1_2,
                                 (ilist_iterator<llvm::ilist_detail::node_options<llvm::BasicBlock,_false,_false,_void>,_false,_false>
                                  *)&bb_1);
        if (!bVar5) {
          std::vector<llvm::Type_*,_std::allocator<llvm::Type_*>_>::~vector
                    ((vector<llvm::Type_*,_std::allocator<llvm::Type_*>_> *)&RetWidth);
          std::vector<llvm::Type_*,_std::allocator<llvm::Type_*>_>::~vector
                    ((vector<llvm::Type_*,_std::allocator<llvm::Type_*>_> *)
                     &MT.super__Vector_base<llvm::Type_*,_std::allocator<llvm::Type_*>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage);
          std::vector<llvm::Type_*,_std::allocator<llvm::Type_*>_>::~vector
                    ((vector<llvm::Type_*,_std::allocator<llvm::Type_*>_> *)
                     &RealArgsTy.super__Vector_base<llvm::Type_*,_std::allocator<llvm::Type_*>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage);
          return;
        }
        pBVar22 = llvm::
                  ilist_iterator<llvm::ilist_detail::node_options<llvm::BasicBlock,_false,_false,_void>,_false,_false>
                  ::operator*(&__end1_2);
        if (bVar4) {
          bVar4 = false;
        }
        else {
          PI_1.It.UI.U._4_4_ = 0;
          E_1 = llvm::pred_begin(pBVar22);
          local_358.It.UI.U = (user_iterator_impl<llvm::User>)llvm::pred_end(pBVar22);
          while( true ) {
            bVar5 = llvm::
                    PredIterator<llvm::BasicBlock,_llvm::Value::user_iterator_impl<llvm::User>_>::
                    operator!=(&E_1,&local_358);
            if (!bVar5) break;
            PI_1.It.UI.U._4_4_ = PI_1.It.UI.U._4_4_ + 1;
            llvm::PredIterator<llvm::BasicBlock,_llvm::Value::user_iterator_impl<llvm::User>_>::
            operator++(&E_1);
          }
          if (PI_1.It.UI.U._4_4_ == 0) {
            exit(0);
          }
        }
        llvm::
        ilist_iterator<llvm::ilist_detail::node_options<llvm::BasicBlock,_false,_false,_void>,_false,_false>
        ::operator++(&__end1_2);
      } while( true );
    }
    pBVar22 = llvm::
              ilist_iterator<llvm::ilist_detail::node_options<llvm::BasicBlock,_false,_false,_void>,_false,_false>
              ::operator*(&__end1_1);
    bVar4 = false;
    __end2 = llvm::BasicBlock::begin(pBVar22);
    i_3 = (Instruction *)llvm::BasicBlock::end(pBVar22);
    while( true ) {
      bVar5 = llvm::operator!=(&__end2,(ilist_iterator<llvm::ilist_detail::node_options<llvm::Instruction,_false,_false,_void>,_false,_false>
                                        *)&i_3);
      if (!bVar5) break;
      Val = llvm::
            ilist_iterator<llvm::ilist_detail::node_options<llvm::Instruction,_false,_false,_void>,_false,_false>
            ::operator*(&__end2);
      bVar5 = llvm::isa<llvm::PHINode,llvm::Instruction>(Val);
      if (!bVar5) {
        bVar4 = true;
      }
      if (bVar4) {
        bVar5 = llvm::isa<llvm::PHINode,llvm::Instruction>(Val);
        if (bVar5) {
          pBVar21 = llvm::Instruction::getParent(Val);
          llvm::Twine::Twine((Twine *)&p.BI,"phisp");
          Name = (Twine *)0x0;
          llvm::BasicBlock::splitBasicBlock(pBVar21,Val,(Twine *)&p.BI,false);
          goto LAB_002821ab;
        }
      }
      llvm::
      ilist_iterator<llvm::ilist_detail::node_options<llvm::Instruction,_false,_false,_void>,_false,_false>
      ::operator++(&__end2);
    }
    llvm::
    ilist_iterator<llvm::ilist_detail::node_options<llvm::BasicBlock,_false,_false,_void>,_false,_false>
    ::operator++(&__end1_1);
  } while( true );
}

Assistant:

void generate() {
  M = new Module("", C);
  if (ARM64) {
    M->setTargetTriple("aarch64-unknown-linux-gnu");
    M->setDataLayout("e-m:e-i8:8:32-i16:16:32-i64:64-i128:128-n32:64-S128");
  }
  std::vector<Type *> ArgsTy, RealArgsTy, MT;
  for (int i = 0; i < N + 2; ++i) {
    makeArg(W, ArgsTy, RealArgsTy);
    makeArg(W, ArgsTy, RealArgsTy);
    makeArg(1, ArgsTy, RealArgsTy);
    makeArg(W / 2, ArgsTy, RealArgsTy);
    makeArg(W * 2, ArgsTy, RealArgsTy);
  }
  int RetWidth = Geni1 ? 1 : W;
  if (Promote != -1 && Promote > RetWidth)
    RetWidth = Promote;
  auto FuncTy = FunctionType::get(Type::getIntNTy(C, RetWidth),
                                  ArgsFromMem ? MT : RealArgsTy, 0);
  F = Function::Create(FuncTy, GlobalValue::ExternalLinkage, BaseName, M);
  BBs.push_back(BasicBlock::Create(C, "", F));
  Builder = new IRBuilder<NoFolder>(BBs[0]);
  int Budget = N;
  Builder->SetInsertPoint(BBs[0]);

  if (ArgsFromMem) {
    for (unsigned i = 0; i < ArgsTy.size(); ++i) {
      Value *a = Builder->CreateLoad(RealArgsTy.at(i), globs.at(i));
      int W = ArgsTy.at(i)->getPrimitiveSizeInBits();
      addArg(a, W, ArgsTy);
    }
  } else {
    unsigned i = 0;
    for (auto it = F->arg_begin(); it != F->arg_end(); ++i, ++it) {
      int W = ArgsTy.at(i)->getPrimitiveSizeInBits();
      addArg(it, W, ArgsTy);
    }
  }

  // the magic happens in genVal()
  Value *V;
  if (Geni1)
    V = genVal(Budget, 1, false, false);
  else
    V = genVal(Budget, W, false, false);

  if ((unsigned)RetWidth > V->getType()->getPrimitiveSizeInBits())
    V = Builder->CreateZExt(V, IntegerType::getIntNTy(C, Promote));
  // terminate the only non-terminated BB
  Builder->CreateRet(V);

  // fixup branch targets
  for (auto &bi : Branches) {
    BasicBlock *BB1 = chooseTarget();
    bi->setSuccessor(0, BB1);
    if (bi->isConditional())
      bi->setSuccessor(1, chooseTarget(BB1));
  }

// finally, fixup the Phis -- first by splitting any BBs where a non-Phi
// precedes a Phi
redo:
  for (auto &bb : *F) {
    bool notphi = false;
    for (auto &i : bb) {
      if (!isa<PHINode>(i))
        notphi = true;
      if (notphi && isa<PHINode>(i)) {
        i.getParent()->splitBasicBlock(&i, "phisp");
        goto redo;
      }
    }
  }

  // and second by giving them incoming edges
  for (auto p = inst_begin(F), pe = inst_end(F); p != pe; ++p) {
    PHINode *P = dyn_cast<PHINode>(&*p);
    if (!P)
      continue;
    BasicBlock *BB = P->getParent();
    for (pred_iterator PI = pred_begin(BB), E = pred_end(BB); PI != E; ++PI) {
      BasicBlock *Pred = *PI;
      assert(Budget == 0);
      Value *V =
          genVal(Budget, P->getType()->getPrimitiveSizeInBits(), true, false);
      P->addIncoming(V, Pred);
    }
  }

  // drop any program where we have a non-entry BB that lacks predecessors;
  // would be better to avoid creating these in the first place
  bool first = true;
  for (auto &bb : *F) {
    if (first) {
      first = false;
    } else {
      int p = 0;
      for (pred_iterator PI = pred_begin(&bb), E = pred_end(&bb); PI != E; ++PI)
        p++;
      if (p == 0) {
        // under what circumstances can this happen?
        exit(0);
      }
    }
  }
}